

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

int side3_4d_filter(double *p0,double *p1,double *p2,double *p3,double *q0,double *q1,double *q2)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar28;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar39;
  undefined1 auVar38 [16];
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dStack_190;
  
  dVar15 = *p0;
  dVar41 = *p1 - dVar15;
  dVar33 = p0[3];
  dVar2 = p1[3] - dVar33;
  dVar50 = p0[1];
  dVar45 = p0[2];
  dVar43 = p1[1] - dVar50;
  dVar11 = p1[2] - dVar45;
  dVar29 = q2[3] - dVar33;
  dVar30 = p2[1] - dVar50;
  dVar36 = q2[2] - dVar45;
  dVar39 = *p2 - dVar15;
  dVar19 = q0[2] - dVar45;
  dVar22 = ABS(dVar43);
  if (ABS(dVar43) <= ABS(dVar2)) {
    dVar22 = ABS(dVar2);
  }
  dVar3 = ABS(dVar11);
  if (ABS(dVar11) <= dVar22) {
    dVar3 = dVar22;
  }
  dVar22 = ABS(dVar41);
  if (ABS(dVar41) <= dVar3) {
    dVar22 = dVar3;
  }
  dVar3 = *q0 - *p0;
  dVar6 = q0[1] - p0[1];
  auVar1._8_4_ = SUB84(dVar6,0);
  auVar1._0_8_ = dVar3;
  auVar1._12_4_ = (int)((ulong)dVar6 >> 0x20);
  dVar4 = ABS(dVar3);
  if (ABS(dVar3) <= ABS(dVar6)) {
    dVar4 = ABS(dVar6);
  }
  dVar6 = ABS(dVar19);
  if (ABS(dVar19) <= dVar4) {
    dVar6 = dVar4;
  }
  dVar4 = q0[3] - dVar33;
  dVar5 = ABS(dVar4);
  if (ABS(dVar4) <= dVar6) {
    dVar5 = dVar6;
  }
  dVar44 = *q1 - dVar15;
  dVar6 = ABS(dVar44);
  if (ABS(dVar44) <= dVar5) {
    dVar6 = dVar5;
  }
  dVar12 = q1[1] - dVar50;
  dVar5 = ABS(dVar12);
  if (ABS(dVar12) <= dVar6) {
    dVar5 = dVar6;
  }
  dVar47 = q1[2] - dVar45;
  dVar6 = ABS(dVar47);
  if (ABS(dVar47) <= dVar5) {
    dVar6 = dVar5;
  }
  dVar49 = q1[3] - dVar33;
  dVar5 = ABS(dVar49);
  if (ABS(dVar49) <= dVar6) {
    dVar5 = dVar6;
  }
  dVar32 = *q2 - dVar15;
  dVar6 = ABS(dVar32);
  if (ABS(dVar32) <= dVar5) {
    dVar6 = dVar5;
  }
  dVar5 = p2[3] - dVar33;
  dVar23 = q2[1] - dVar50;
  dVar28 = p2[2] - dVar45;
  auVar26._0_8_ = ABS(dVar23);
  auVar26._8_8_ = ABS(dVar28);
  auVar27._8_4_ = SUB84(ABS(dVar5),0);
  auVar27._0_8_ = dVar6;
  auVar27._12_4_ = (int)((ulong)ABS(dVar5) >> 0x20);
  auVar27 = maxpd(auVar26,auVar27);
  auVar38._0_8_ = ABS(dVar36);
  auVar38._8_8_ = ABS(dVar39);
  auVar27 = maxpd(auVar38,auVar27);
  auVar17._0_8_ = ABS(dVar29);
  auVar17._8_8_ = ABS(dVar30);
  auVar27 = maxpd(auVar17,auVar27);
  dVar18 = auVar27._8_8_;
  dVar24 = dVar22;
  dVar6 = dVar18;
  if ((dVar22 <= dVar18) && (dVar6 = dVar22, dVar22 < dVar18)) {
    dVar24 = dVar18;
  }
  dVar16 = auVar27._0_8_;
  dVar13 = dVar16;
  if ((dVar6 <= dVar16) && (dVar13 = dVar6, dVar24 < dVar16)) {
    dVar24 = dVar16;
  }
  iVar7 = 0;
  iVar8 = 0;
  if ((1.895283954029418e-74 <= dVar13) && (iVar8 = iVar7, dVar24 <= 1.2980742146337065e+33)) {
    dStack_190 = auVar1._8_8_;
    dVar48 = dVar2 * dVar49 + dVar11 * dVar47 + dVar41 * dVar44 + dVar43 * dVar12;
    dVar51 = dVar2 * dVar29 + dVar11 * dVar36 + dVar41 * dVar32 + dVar43 * dVar23;
    dVar24 = dVar5 * dVar49 + dVar28 * dVar47 + dVar39 * dVar44 + dVar30 * dVar12;
    dVar25 = dVar5 * dVar29 + dVar28 * dVar36 + dVar39 * dVar32 + dVar30 * dVar23;
    dVar37 = dVar2 * dVar4 + dVar11 * dVar19 + dVar41 * dVar3 + dVar43 * dStack_190;
    dVar42 = dVar5 * dVar4 + dVar28 * dVar19 + dVar39 * dVar3 + dVar30 * dStack_190;
    dVar48 = dVar48 + dVar48;
    dVar51 = dVar51 + dVar51;
    dVar24 = dVar24 + dVar24;
    dVar25 = dVar25 + dVar25;
    dVar37 = dVar37 + dVar37;
    dVar42 = dVar42 + dVar42;
    dVar13 = dVar48 * dVar25 - dVar24 * dVar51;
    dVar6 = dVar51 * dVar42 - dVar25 * dVar37;
    dVar20 = dVar37 * dVar24 - dVar42 * dVar48;
    dVar40 = dVar13 + dVar6 + dVar20;
    dVar31 = dVar22 * dVar16 * dVar18 * dVar16 * 1.7244368241093199e-13;
    if (dVar40 <= dVar31) {
      if (-dVar31 <= dVar40) {
        return 0;
      }
      iVar7 = -1;
    }
    else {
      iVar7 = 1;
    }
    dVar15 = *p3 - dVar15;
    dVar50 = p3[1] - dVar50;
    dVar45 = p3[2] - dVar45;
    dVar33 = p3[3] - dVar33;
    dVar31 = ABS(dVar15);
    if (ABS(dVar15) <= dVar22) {
      dVar31 = dVar22;
    }
    dVar14 = ABS(dVar33);
    if (ABS(dVar33) <= dVar31) {
      dVar14 = dVar31;
    }
    dVar31 = ABS(dVar45);
    if (ABS(dVar45) <= dVar14) {
      dVar31 = dVar14;
    }
    dVar14 = ABS(dVar50);
    if (ABS(dVar50) <= dVar31) {
      dVar14 = dVar31;
    }
    dVar31 = dVar14;
    if (dVar14 <= dVar22) {
      dVar31 = dVar22;
    }
    dVar34 = dVar16;
    if (dVar16 <= dVar31) {
      dVar34 = dVar31;
    }
    dVar31 = dVar16;
    if (dVar16 <= dVar22) {
      dVar31 = dVar22;
    }
    dVar21 = dVar31;
    if (dVar31 <= dVar34) {
      dVar21 = dVar34;
    }
    dVar34 = dVar21;
    if (dVar21 <= dVar22) {
      dVar34 = dVar22;
    }
    dVar22 = dVar14;
    if (dVar14 <= dVar34) {
      dVar22 = dVar34;
    }
    dVar22 = (double)(~-(ulong)(dVar22 < dVar18) & (ulong)dVar22 |
                     (ulong)dVar18 & -(ulong)(dVar22 < dVar18));
    dVar34 = (double)(~-(ulong)(dVar14 < dVar21) & (ulong)dVar21 |
                     (ulong)dVar14 & -(ulong)(dVar14 < dVar21));
    uVar9 = -(ulong)(dVar22 < dVar16);
    uVar10 = -(ulong)(dVar18 < dVar34);
    dVar22 = (double)(~uVar9 & (ulong)dVar22 | (ulong)dVar16 & uVar9);
    dVar34 = (double)(~uVar10 & (ulong)dVar34 | (ulong)dVar18 & uVar10);
    uVar9 = -(ulong)(dVar22 < dVar31);
    uVar10 = -(ulong)(dVar16 < dVar34);
    dVar35 = (double)(~uVar9 & (ulong)dVar22 | (ulong)dVar31 & uVar9);
    dVar34 = (double)(~uVar10 & (ulong)dVar34 | (ulong)dVar16 & uVar10);
    dVar22 = dVar35;
    if ((dVar35 < dVar34) || (dVar46 = dVar35, dVar22 = dVar34, dVar35 <= dVar21)) {
      dVar34 = dVar22;
      dVar46 = dVar21;
    }
    if (dVar46 <= 1.2980742146337065e+33) {
      dVar22 = dVar31;
      if (dVar34 <= dVar31) {
        dVar22 = dVar34;
      }
      if (4.1460764440172624e-50 <= dVar22) {
        dVar11 = dVar2 * dVar2 + dVar11 * dVar11 + dVar41 * dVar41 + dVar43 * dVar43;
        dVar30 = dVar5 * dVar5 + dVar28 * dVar28 + dVar39 * dVar39 + dVar30 * dVar30;
        dVar22 = dVar49 * dVar33 + dVar47 * dVar45 + dVar44 * dVar15 + dVar12 * dVar50;
        dVar19 = dVar4 * dVar33 + dVar19 * dVar45 + dVar3 * dVar15 + dStack_190 * dVar50;
        dVar2 = dVar29 * dVar33 + dVar36 * dVar45 + dVar32 * dVar15 + dVar23 * dVar50;
        dVar33 = dVar40 * (dVar33 * dVar33 + dVar45 * dVar45 + dVar15 * dVar15 + dVar50 * dVar50) -
                 ((dVar20 + (dVar42 - dVar24) * dVar11 + (dVar48 - dVar37) * dVar30) *
                  (dVar2 + dVar2) +
                 (dVar6 + (dVar25 - dVar42) * dVar11 + (dVar37 - dVar51) * dVar30) *
                 (dVar22 + dVar22) +
                 (dVar19 + dVar19) *
                 (dVar13 + (dVar24 - dVar25) * dVar11 + (dVar51 - dVar48) * dVar30));
        dVar15 = dVar14 * dVar16 * dVar18 * dVar31 * dVar21 * dVar35 * 4.380468888011788e-12;
        if (dVar33 <= dVar15) {
          if (-dVar15 <= dVar33) {
            return 0;
          }
          iVar8 = -1;
        }
        else {
          iVar8 = 1;
        }
        iVar8 = iVar8 * iVar7;
      }
    }
  }
  return iVar8;
}

Assistant:

inline int side3_4d_filter( const double* p0, const double* p1, const double* p2, const double* p3, const double* q0, const double* q1, const double* q2) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double l1;
    l1 = (1 * ((((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)) + (p1_2_p0_2 * p1_2_p0_2)) + (p1_3_p0_3 * p1_3_p0_3)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double p2_2_p0_2 = (p2[2] - p0[2]);
    double p2_3_p0_3 = (p2[3] - p0[3]);
    double l2;
    l2 = (1 * ((((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)) + (p2_2_p0_2 * p2_2_p0_2)) + (p2_3_p0_3 * p2_3_p0_3)));
    double p3_0_p0_0 = (p3[0] - p0[0]);
    double p3_1_p0_1 = (p3[1] - p0[1]);
    double p3_2_p0_2 = (p3[2] - p0[2]);
    double p3_3_p0_3 = (p3[3] - p0[3]);
    double l3;
    l3 = (1 * ((((p3_0_p0_0 * p3_0_p0_0) + (p3_1_p0_1 * p3_1_p0_1)) + (p3_2_p0_2 * p3_2_p0_2)) + (p3_3_p0_3 * p3_3_p0_3)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double a10;
    a10 = (2 * ((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double q1_2_p0_2 = (q1[2] - p0[2]);
    double q1_3_p0_3 = (q1[3] - p0[3]);
    double a11;
    a11 = (2 * ((((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)) + (p1_2_p0_2 * q1_2_p0_2)) + (p1_3_p0_3 * q1_3_p0_3)));
    double q2_0_p0_0 = (q2[0] - p0[0]);
    double q2_1_p0_1 = (q2[1] - p0[1]);
    double q2_2_p0_2 = (q2[2] - p0[2]);
    double q2_3_p0_3 = (q2[3] - p0[3]);
    double a12;
    a12 = (2 * ((((p1_0_p0_0 * q2_0_p0_0) + (p1_1_p0_1 * q2_1_p0_1)) + (p1_2_p0_2 * q2_2_p0_2)) + (p1_3_p0_3 * q2_3_p0_3)));
    double a20;
    a20 = (2 * ((((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)) + (p2_2_p0_2 * q0_2_p0_2)) + (p2_3_p0_3 * q0_3_p0_3)));
    double a21;
    a21 = (2 * ((((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)) + (p2_2_p0_2 * q1_2_p0_2)) + (p2_3_p0_3 * q1_3_p0_3)));
    double a22;
    a22 = (2 * ((((p2_0_p0_0 * q2_0_p0_0) + (p2_1_p0_1 * q2_1_p0_1)) + (p2_2_p0_2 * q2_2_p0_2)) + (p2_3_p0_3 * q2_3_p0_3)));
    double a30;
    a30 = (2 * ((((p3_0_p0_0 * q0_0_p0_0) + (p3_1_p0_1 * q0_1_p0_1)) + (p3_2_p0_2 * q0_2_p0_2)) + (p3_3_p0_3 * q0_3_p0_3)));
    double a31;
    a31 = (2 * ((((p3_0_p0_0 * q1_0_p0_0) + (p3_1_p0_1 * q1_1_p0_1)) + (p3_2_p0_2 * q1_2_p0_2)) + (p3_3_p0_3 * q1_3_p0_3)));
    double a32;
    a32 = (2 * ((((p3_0_p0_0 * q2_0_p0_0) + (p3_1_p0_1 * q2_1_p0_1)) + (p3_2_p0_2 * q2_2_p0_2)) + (p3_3_p0_3 * q2_3_p0_3)));
    double b00;
    b00 = ((a11 * a22) - (a12 * a21));
    double b01;
    b01 = (a21 - a22);
    double b02;
    b02 = (a12 - a11);
    double b10;
    b10 = ((a12 * a20) - (a10 * a22));
    double b11;
    b11 = (a22 - a20);
    double b12;
    b12 = (a10 - a12);
    double b20;
    b20 = ((a10 * a21) - (a11 * a20));
    double b21;
    b21 = (a20 - a21);
    double b22;
    b22 = (a11 - a10);
    double Delta;
    Delta = ((b00 + b10) + b20);
    double DeltaLambda0;
    DeltaLambda0 = (((b01 * l1) + (b02 * l2)) + b00);
    double DeltaLambda1;
    DeltaLambda1 = (((b11 * l1) + (b12 * l2)) + b10);
    double DeltaLambda2;
    DeltaLambda2 = (((b21 * l1) + (b22 * l2)) + b20);
    double r;
    r = ((Delta * l3) - (((a30 * DeltaLambda0) + (a31 * DeltaLambda1)) + (a32 * DeltaLambda2)));
    double eps;
    double max1 = fabs(p1_3_p0_3);
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_0_p0_0)) )
    {
        max1 = fabs(p1_0_p0_0);
    } 
    double max2 = fabs(p2_3_p0_3);
    if( (max2 < fabs(p2_2_p0_2)) )
    {
        max2 = fabs(p2_2_p0_2);
    } 
    if( (max2 < fabs(p2_0_p0_0)) )
    {
        max2 = fabs(p2_0_p0_0);
    } 
    if( (max2 < fabs(p2_1_p0_1)) )
    {
        max2 = fabs(p2_1_p0_1);
    } 
    double max3 = fabs(q0_1_p0_1);
    if( (max3 < fabs(q0_0_p0_0)) )
    {
        max3 = fabs(q0_0_p0_0);
    } 
    if( (max3 < fabs(q0_2_p0_2)) )
    {
        max3 = fabs(q0_2_p0_2);
    } 
    if( (max3 < fabs(q0_3_p0_3)) )
    {
        max3 = fabs(q0_3_p0_3);
    } 
    if( (max3 < fabs(q1_0_p0_0)) )
    {
        max3 = fabs(q1_0_p0_0);
    } 
    if( (max3 < fabs(q1_1_p0_1)) )
    {
        max3 = fabs(q1_1_p0_1);
    } 
    if( (max3 < fabs(q1_2_p0_2)) )
    {
        max3 = fabs(q1_2_p0_2);
    } 
    if( (max3 < fabs(q1_3_p0_3)) )
    {
        max3 = fabs(q1_3_p0_3);
    } 
    if( (max3 < fabs(q2_0_p0_0)) )
    {
        max3 = fabs(q2_0_p0_0);
    } 
    if( (max3 < fabs(q2_1_p0_1)) )
    {
        max3 = fabs(q2_1_p0_1);
    } 
    if( (max3 < fabs(q2_2_p0_2)) )
    {
        max3 = fabs(q2_2_p0_2);
    } 
    if( (max3 < fabs(q2_3_p0_3)) )
    {
        max3 = fabs(q2_3_p0_3);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (lower_bound_1 < 1.89528395402941802921e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (1.72443682410931985179e-13 * (((max1 * max3) * max2) * max3));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    double max4 = max1;
    double max5 = max1;
    double max6 = max1;
    if( (max6 < fabs(p3_0_p0_0)) )
    {
        max6 = fabs(p3_0_p0_0);
    } 
    if( (max6 < fabs(p3_3_p0_3)) )
    {
        max6 = fabs(p3_3_p0_3);
    } 
    if( (max6 < fabs(p3_2_p0_2)) )
    {
        max6 = fabs(p3_2_p0_2);
    } 
    if( (max6 < fabs(p3_1_p0_1)) )
    {
        max6 = fabs(p3_1_p0_1);
    } 
    if( (max5 < max6) )
    {
        max5 = max6;
    } 
    if( (max5 < max3) )
    {
        max5 = max3;
    } 
    double max7 = max1;
    if( (max7 < max3) )
    {
        max7 = max3;
    } 
    if( (max5 < max7) )
    {
        max5 = max7;
    } 
    if( (max4 < max5) )
    {
        max4 = max5;
    } 
    if( (max4 < max6) )
    {
        max4 = max6;
    } 
    if( (max4 < max2) )
    {
        max4 = max2;
    } 
    if( (max4 < max3) )
    {
        max4 = max3;
    } 
    if( (max4 < max7) )
    {
        max4 = max7;
    } 
    int r_sign;
    int int_tmp_result_FFWKCAA;
    lower_bound_1 = max5;
    upper_bound_1 = max5;
    if( (max6 < lower_bound_1) )
    {
        lower_bound_1 = max6;
    } 
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    else 
    {
        if( (max4 > upper_bound_1) )
        {
            upper_bound_1 = max4;
        } 
    } 
    if( (max7 < lower_bound_1) )
    {
        lower_bound_1 = max7;
    } 
    if( (lower_bound_1 < 4.14607644401726239868e-50) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (4.38046888801178809320e-12 * (((((max6 * max3) * max2) * max7) * max5) * max4));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    r_sign = int_tmp_result_FFWKCAA;
    return (Delta_sign * r_sign);
}